

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerFlow.cpp
# Opt level: O3

bool __thiscall WorkerFlow::recv_stream(WorkerFlow *this)

{
  Callback *pCVar1;
  int iVar2;
  string *this_00;
  int *piVar3;
  char *__s;
  allocator<char> local_11;
  
  iVar2 = zmq_recv(this->m_stream_socket,this->m_buffer,this->m_buffsize,0);
  if (iVar2 != -1) {
    pCVar1 = this->m_cb;
    if (pCVar1 != (Callback *)0x0) {
      (*pCVar1->_vptr_Callback[1])(pCVar1,this->m_buffer,(long)iVar2);
    }
    return true;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  piVar3 = __errno_location();
  __s = strerror(*piVar3);
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,&local_11);
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

bool WorkerFlow::recv_stream()
{
    // receive a workload into the worker buffer.
    int size = zmq_recv(m_stream_socket, m_buffer, m_buffsize, 0);
    if (size == -1) {
        throw std::string(strerror(errno));
    }

    // tell the callback that there's workload to take.
    if (m_cb) {
        m_cb->on_workload(m_buffer, size);
    }

    // Keep receiving
    return true;
}